

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O0

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
::clear(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
        *this)

{
  bool bVar1;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
  *in_RDI;
  int id;
  Item it;
  Notifier *nf;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb8;
  Arc local_30;
  Arc local_2c;
  Notifier *local_28;
  long local_18;
  long local_10;
  undefined1 *local_8;
  
  local_28 = AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
             ::ObserverBase::notifier((ObserverBase *)in_RDI);
  if ((int)(in_RDI->_observers).
           super__List_base<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*>_>
           ._M_impl._M_node._M_size != 0) {
    SmartDigraphBase::Arc::Arc(&local_2c);
    AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
    ::first(in_RDI,(Item *)in_stack_ffffffffffffffb8);
    while( true ) {
      SmartDigraphBase::Arc::Arc(&local_30);
      bVar1 = SmartDigraphBase::Arc::operator!=(&local_2c,local_30);
      if (!bVar1) break;
      AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
      ::id(in_RDI,(Item *)in_stack_ffffffffffffffb8);
      std::allocator_traits<std::allocator<std::vector<double,std::allocator<double>>>>::
      destroy<std::vector<double,std::allocator<double>>>
                ((allocator_type *)in_RDI,in_stack_ffffffffffffffb8);
      AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
      ::next(in_RDI,(Item *)in_stack_ffffffffffffffb8);
    }
    local_8 = (undefined1 *)((long)&(in_RDI->_lock)._lock + 8);
    local_10 = (in_RDI->_lock)._lock.__align;
    local_18 = (long)(int)(in_RDI->_observers).
                          super__List_base<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*>_>
                          ._M_impl._M_node._M_size;
    __gnu_cxx::new_allocator<std::vector<double,_std::allocator<double>_>_>::deallocate
              ((new_allocator<std::vector<double,_std::allocator<double>_>_> *)in_RDI,
               in_stack_ffffffffffffffb8,0x2b79d4);
    *(undefined4 *)
     &(in_RDI->_observers).
      super__List_base<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*>_>
      ._M_impl._M_node._M_size = 0;
  }
  return;
}

Assistant:

virtual void clear() {
    Notifier* nf = Parent::notifier();
    if (capacity != 0) {
      Item it;
      for (nf->first(it); it != INVALID; nf->next(it)) {
        int id = nf->id(it);
        AllocatorTraits::destroy(allocator, &(values[id]));
      }
      allocator.deallocate(values, capacity);
      capacity = 0;
    }
  }